

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::ProcessDirectory
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *passed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *failed)

{
  size_type *psVar1;
  cmCTest *pcVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  cmCTestBatchTestHandler *pcVar6;
  ostream *poVar7;
  time_t tVar8;
  pointer pbVar9;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  mapped_type *ppcVar10;
  cmCTestTestProperties *p;
  mapped_type pcVar11;
  pointer __lhs;
  iterator i;
  pointer __rhs;
  double dVar12;
  TestSet depends;
  TestMap tests;
  PropertiesMap properties;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  size_type *local_c0;
  undefined8 local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  cmCTestBatchTestHandler *local_a0;
  double local_98;
  undefined1 local_90 [32];
  _Base_ptr local_70;
  size_t local_68;
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  local_60;
  
  ComputeTestList(this);
  cmCTest::CurrentTime_abi_cxx11_((string *)local_90,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::operator=((string *)&this->StartTest,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  dVar12 = cmsys::SystemTools::GetTime();
  this->StartTestTime = (uint)(long)dVar12;
  local_98 = cmsys::SystemTools::GetTime();
  if (((this->super_cmCTestGenericHandler).CTest)->BatchJobs == true) {
    pcVar6 = (cmCTestBatchTestHandler *)operator_new(0x200);
    cmCTestBatchTestHandler::cmCTestBatchTestHandler(pcVar6);
  }
  else {
    pcVar6 = (cmCTestBatchTestHandler *)operator_new(0x1e0);
    cmCTestMultiProcessHandler::cmCTestMultiProcessHandler((cmCTestMultiProcessHandler *)pcVar6);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  (pcVar6->super_cmCTestMultiProcessHandler).CTest = pcVar2;
  cmCTestMultiProcessHandler::SetParallelLevel
            (&pcVar6->super_cmCTestMultiProcessHandler,(long)pcVar2->ParallelLevel);
  (pcVar6->super_cmCTestMultiProcessHandler).TestHandler = this;
  (pcVar6->super_cmCTestMultiProcessHandler).Quiet = (this->super_cmCTestGenericHandler).Quiet;
  poVar7 = std::operator<<(this->LogFile,"Start testing: ");
  cmCTest::CurrentTime_abi_cxx11_((string *)local_90,(this->super_cmCTestGenericHandler).CTest);
  poVar7 = std::operator<<(poVar7,(string *)local_90);
  poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<(poVar7,"----------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)local_90);
  local_90._24_8_ = local_90 + 8;
  local_90._8_4_ = _S_red;
  local_90._16_8_ = 0;
  local_68 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = (_Base_ptr)local_90._24_8_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string
            ((string *)&local_e0,
             (string *)&((this->super_cmCTestGenericHandler).CTest)->ScheduleType);
  local_b0 = passed;
  local_a8 = failed;
  local_a0 = pcVar6;
  bVar3 = std::operator==(&local_e0,"Random");
  std::__cxx11::string::~string((string *)&local_e0);
  if (bVar3) {
    tVar8 = time((time_t *)0x0);
    srand((uint)tVar8);
  }
  pcVar11 = (this->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = &local_e0._M_string_length;
  do {
    pcVar6 = local_a0;
    if (pcVar11 ==
        (this->TestList).
        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cmCTestMultiProcessHandler::SetTests
                (&local_a0->super_cmCTestMultiProcessHandler,(TestMap *)local_90,
                 (PropertiesMap *)&local_60);
      (pcVar6->super_cmCTestMultiProcessHandler).Passed = local_b0;
      (pcVar6->super_cmCTestMultiProcessHandler).Failed = local_a8;
      std::
      vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
      ::clear(&this->TestResults);
      (pcVar6->super_cmCTestMultiProcessHandler).TestResults = &this->TestResults;
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      if (pcVar2->PrintLabels == true) {
        cmCTestMultiProcessHandler::PrintLabels(&pcVar6->super_cmCTestMultiProcessHandler);
      }
      else {
        bVar3 = cmCTest::GetShowOnly(pcVar2);
        if (bVar3) {
          cmCTestMultiProcessHandler::PrintTestList(&pcVar6->super_cmCTestMultiProcessHandler);
        }
        else {
          (*(pcVar6->super_cmCTestMultiProcessHandler)._vptr_cmCTestMultiProcessHandler[2])(pcVar6);
        }
      }
      (*(pcVar6->super_cmCTestMultiProcessHandler)._vptr_cmCTestMultiProcessHandler[1])(pcVar6);
      cmCTest::CurrentTime_abi_cxx11_(&local_e0,(this->super_cmCTestGenericHandler).CTest);
      std::__cxx11::string::operator=((string *)&this->EndTest,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      dVar12 = cmsys::SystemTools::GetTime();
      this->EndTestTime = (uint)(long)dVar12;
      dVar12 = cmsys::SystemTools::GetTime();
      this->ElapsedTestingTime = dVar12 - local_98;
      poVar7 = std::operator<<(this->LogFile,"End testing: ");
      cmCTest::CurrentTime_abi_cxx11_(&local_e0,(this->super_cmCTestGenericHandler).CTest);
      poVar7 = std::operator<<(poVar7,(string *)&local_e0);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&local_e0);
      std::
      _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                   *)local_90);
      return;
    }
    local_e0._M_string_length._0_4_ = 0;
    local_e0.field_2._M_allocated_capacity = 0;
    local_b8 = 0;
    local_e0.field_2._8_8_ = psVar1;
    local_c0 = psVar1;
    if (bVar3) {
      iVar5 = rand();
      pcVar11->Cost = (float)iVar5;
    }
    if ((pcVar11->Timeout == 0.0) && (!NAN(pcVar11->Timeout))) {
      dVar12 = ((this->super_cmCTestGenericHandler).CTest)->GlobalTimeout;
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        pcVar11->Timeout = dVar12;
      }
    }
    __rhs = (pcVar11->Depends).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (pcVar11->Depends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__rhs != pbVar9) {
      for (; __rhs != pbVar9; __rhs = __rhs + 1) {
        for (__lhs = (this->TestList).
                     super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __lhs != (this->TestList).
                     super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                     ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
          _Var4 = std::operator==(&__lhs->Name,__rhs);
          if (_Var4) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_e0,&__lhs->Index);
            break;
          }
        }
        pbVar9 = (pcVar11->Depends).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    this_00 = (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
              std::
              map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ::operator[]((map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                            *)local_90,&pcVar11->Index);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
              (this_00,(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)&local_e0);
    ppcVar10 = std::
               map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ::operator[]((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             *)&local_60,&pcVar11->Index);
    *ppcVar10 = pcVar11;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &local_e0);
    pcVar11 = pcVar11 + 1;
  } while( true );
}

Assistant:

void cmCTestTestHandler::ProcessDirectory(std::vector<std::string> &passed,
                                         std::vector<std::string> &failed)
{
  this->ComputeTestList();
  this->StartTest = this->CTest->CurrentTime();
  this->StartTestTime = static_cast<unsigned int>(cmSystemTools::GetTime());
  double elapsed_time_start = cmSystemTools::GetTime();

  cmCTestMultiProcessHandler* parallel = this->CTest->GetBatchJobs() ?
    new cmCTestBatchTestHandler : new cmCTestMultiProcessHandler;
  parallel->SetCTest(this->CTest);
  parallel->SetParallelLevel(this->CTest->GetParallelLevel());
  parallel->SetTestHandler(this);
  parallel->SetQuiet(this->Quiet);

  *this->LogFile << "Start testing: "
    << this->CTest->CurrentTime() << std::endl
    << "----------------------------------------------------------"
    << std::endl;

  cmCTestMultiProcessHandler::TestMap tests;
  cmCTestMultiProcessHandler::PropertiesMap properties;

  bool randomSchedule = this->CTest->GetScheduleType() == "Random";
  if(randomSchedule)
    {
    srand((unsigned)time(0));
    }

  for (ListOfTests::iterator it = this->TestList.begin();
       it != this->TestList.end(); ++it)
    {
    cmCTestTestProperties& p = *it;
    cmCTestMultiProcessHandler::TestSet depends;

    if(randomSchedule)
      {
      p.Cost = static_cast<float>(rand());
      }

    if(p.Timeout == 0 && this->CTest->GetGlobalTimeout() != 0)
      {
      p.Timeout = this->CTest->GetGlobalTimeout();
      }

    if(!p.Depends.empty())
      {
      for(std::vector<std::string>::iterator i = p.Depends.begin();
          i != p.Depends.end(); ++i)
        {
        for(ListOfTests::iterator it2 = this->TestList.begin();
            it2 != this->TestList.end(); ++it2)
          {
          if(it2->Name == *i)
            {
            depends.insert(it2->Index);
            break; // break out of test loop as name can only match 1
            }
          }
        }
      }
    tests[it->Index] = depends;
    properties[it->Index] = &*it;
    }
  parallel->SetTests(tests, properties);
  parallel->SetPassFailVectors(&passed, &failed);
  this->TestResults.clear();
  parallel->SetTestResults(&this->TestResults);

  if(this->CTest->ShouldPrintLabels())
    {
    parallel->PrintLabels();
    }
  else if(this->CTest->GetShowOnly())
    {
    parallel->PrintTestList();
    }
  else
    {
    parallel->RunTests();
    }
  delete parallel;
  this->EndTest = this->CTest->CurrentTime();
  this->EndTestTime = static_cast<unsigned int>(cmSystemTools::GetTime());
  this->ElapsedTestingTime = cmSystemTools::GetTime() - elapsed_time_start;
  *this->LogFile << "End testing: "
     << this->CTest->CurrentTime() << std::endl;
}